

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

bool duckdb_yyjson::unsafe_yyjson_equals(yyjson_val *lhs,yyjson_val *rhs)

{
  void *__s2;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  char *pcVar5;
  byte bVar6;
  char *pcVar7;
  byte bVar8;
  ulong __n;
  yyjson_val *pyVar9;
  yyjson_val *pyVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  yyjson_val *pyVar14;
  yyjson_val *pyVar15;
  ulong uVar16;
  
  uVar4 = lhs->tag;
  bVar6 = (byte)uVar4 & 7;
  uVar12 = rhs->tag;
  if (bVar6 == ((byte)uVar12 & 7)) {
    switch(bVar6) {
    case 0:
      break;
    default:
      if (uVar4 >> 8 == uVar12 >> 8) {
        iVar2 = bcmp((lhs->uni).ptr,(rhs->uni).ptr,uVar4 >> 8);
        return iVar2 == 0;
      }
      break;
    case 2:
    case 3:
      return uVar4 == uVar12;
    case 4:
      bVar8 = (byte)uVar4 & 0x18;
      bVar6 = (byte)uVar12 & 0x18;
      if (bVar8 == bVar6) {
        uVar3 = (lhs->uni).u64;
LAB_0188a979:
        return uVar3 == (rhs->uni).u64;
      }
      if (bVar8 == 8 && (uVar12 & 0x18) == 0) {
        uVar3 = (lhs->uni).i64;
        if (-1 < (long)uVar3) goto LAB_0188a979;
      }
      else if (((uVar4 & 0x18) == 0 && bVar6 == 8) && (-1 < (rhs->uni).i64)) {
        return (lhs->uni).u64 == (rhs->uni).i64;
      }
      break;
    case 6:
      uVar11 = uVar4 >> 8;
      if (uVar11 == uVar12 >> 8) {
        if (uVar4 < 0x100) {
          return true;
        }
        pyVar9 = rhs + 1;
        pyVar14 = lhs + 1;
        do {
          bVar1 = unsafe_yyjson_equals(pyVar14,pyVar9);
          if (!bVar1) {
            return bVar1;
          }
          pcVar7 = (char *)0x10;
          pcVar5 = (char *)0x10;
          if ((~(uint)pyVar14->tag & 6) == 0) {
            pcVar5 = (pyVar14->uni).str;
          }
          if ((~(uint)pyVar9->tag & 6) == 0) {
            pcVar7 = (pyVar9->uni).str;
          }
          pyVar14 = (yyjson_val *)(pcVar5 + (long)&pyVar14->tag);
          pyVar9 = (yyjson_val *)(pcVar7 + (long)&pyVar9->tag);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        return bVar1;
      }
      break;
    case 7:
      uVar11 = uVar4 >> 8;
      if (uVar11 == uVar12 >> 8) {
        if (0xff < uVar4) {
          pyVar15 = lhs + 1;
          pyVar14 = rhs + 1;
          uVar4 = uVar11;
          pyVar9 = pyVar14;
          uVar12 = 0;
          do {
            __s2 = (pyVar15->uni).ptr;
            if (__s2 == (void *)0x0) {
              return false;
            }
            pyVar10 = pyVar9;
            uVar16 = uVar12;
            if (uVar12 == uVar11) {
              uVar16 = 0;
              pyVar10 = pyVar14;
            }
            if (uVar11 <= uVar16) {
              return false;
            }
            uVar4 = uVar4 - 1;
            __n = pyVar15->tag >> 8;
            uVar13 = uVar11;
            while( true ) {
              pcVar5 = (char *)0x10;
              if ((~(uint)pyVar10[1].tag & 6) == 0) {
                pcVar5 = pyVar10[1].uni.str;
              }
              uVar16 = uVar16 + 1;
              pyVar9 = (yyjson_val *)(pcVar5 + (long)pyVar10 + 0x10);
              if ((pyVar10->tag >> 8 == __n) &&
                 (iVar2 = bcmp((pyVar10->uni).ptr,__s2,__n), iVar2 == 0)) break;
              pyVar10 = pyVar9;
              if (uVar12 < uVar11 && uVar16 == uVar11) {
                uVar16 = 0;
                pyVar10 = pyVar14;
                uVar13 = uVar12;
              }
              if (uVar13 <= uVar16) {
                return false;
              }
            }
            bVar1 = unsafe_yyjson_equals(pyVar15 + 1,pyVar10 + 1);
            if (!bVar1) {
              return false;
            }
            pcVar5 = (char *)0x10;
            if ((~(uint)pyVar15[1].tag & 6) == 0) {
              pcVar5 = pyVar15[1].uni.str;
            }
            pyVar15 = (yyjson_val *)(pcVar5 + (long)&pyVar15[1].tag);
            uVar12 = uVar16;
          } while (uVar4 != 0);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool unsafe_yyjson_equals(yyjson_val *lhs, yyjson_val *rhs) {
    yyjson_type type = unsafe_yyjson_get_type(lhs);
    if (type != unsafe_yyjson_get_type(rhs)) return false;

    switch (type) {
        case YYJSON_TYPE_OBJ: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                yyjson_obj_iter iter;
                yyjson_obj_iter_init(rhs, &iter);
                lhs = unsafe_yyjson_get_first(lhs);
                while (len-- > 0) {
                    rhs = yyjson_obj_iter_getn(&iter, lhs->uni.str,
                                               unsafe_yyjson_get_len(lhs));
                    if (!rhs) return false;
                    if (!unsafe_yyjson_equals(lhs + 1, rhs)) return false;
                    lhs = unsafe_yyjson_get_next(lhs + 1);
                }
            }
            /* yyjson allows duplicate keys, so the check may be inaccurate */
            return true;
        }

        case YYJSON_TYPE_ARR: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                lhs = unsafe_yyjson_get_first(lhs);
                rhs = unsafe_yyjson_get_first(rhs);
                while (len-- > 0) {
                    if (!unsafe_yyjson_equals(lhs, rhs)) return false;
                    lhs = unsafe_yyjson_get_next(lhs);
                    rhs = unsafe_yyjson_get_next(rhs);
                }
            }
            return true;
        }

        case YYJSON_TYPE_NUM:
            return unsafe_yyjson_num_equals(lhs, rhs);

        case YYJSON_TYPE_RAW:
        case YYJSON_TYPE_STR:
            return unsafe_yyjson_str_equals(lhs, rhs);

        case YYJSON_TYPE_NULL:
        case YYJSON_TYPE_BOOL:
            return lhs->tag == rhs->tag;

        default:
            return false;
    }
}